

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * columnName(sqlite3_stmt *pStmt,int N,int useUtf16,int useType)

{
  sqlite3 *db_00;
  int iVar1;
  sqlite3 *db;
  int n;
  Vdbe *p;
  void *ret;
  int useType_local;
  int useUtf16_local;
  int N_local;
  sqlite3_stmt *pStmt_local;
  
  p = (Vdbe *)0x0;
  db_00 = *(sqlite3 **)pStmt;
  iVar1 = sqlite3_column_count(pStmt);
  if ((N < iVar1) && (-1 < N)) {
    iVar1 = useType * iVar1 + N;
    sqlite3_mutex_enter(db_00->mutex);
    if (useUtf16 == 0) {
      p = (Vdbe *)sqlite3_value_text((sqlite3_value *)(*(long *)(pStmt + 0x98) + (long)iVar1 * 0x38)
                                    );
    }
    else {
      p = (Vdbe *)sqlite3_value_text16
                            ((sqlite3_value *)(*(long *)(pStmt + 0x98) + (long)iVar1 * 0x38));
    }
    if (db_00->mallocFailed != '\0') {
      sqlite3OomClear(db_00);
      p = (Vdbe *)0x0;
    }
    sqlite3_mutex_leave(db_00->mutex);
  }
  return p;
}

Assistant:

static const void *columnName(
  sqlite3_stmt *pStmt,     /* The statement */
  int N,                   /* Which column to get the name for */
  int useUtf16,            /* True to return the name as UTF16 */
  int useType              /* What type of name */
){
  const void *ret;
  Vdbe *p;
  int n;
  sqlite3 *db;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pStmt==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  ret = 0;
  p = (Vdbe *)pStmt;
  db = p->db;
  assert( db!=0 );
  n = sqlite3_column_count(pStmt);
  if( N<n && N>=0 ){
    N += useType*n;
    sqlite3_mutex_enter(db->mutex);
    assert( db->mallocFailed==0 );
#ifndef SQLITE_OMIT_UTF16
    if( useUtf16 ){
      ret = sqlite3_value_text16((sqlite3_value*)&p->aColName[N]);
    }else
#endif
    {
      ret = sqlite3_value_text((sqlite3_value*)&p->aColName[N]);
    }
    /* A malloc may have failed inside of the _text() call. If this
    ** is the case, clear the mallocFailed flag and return NULL.
    */
    if( db->mallocFailed ){
      sqlite3OomClear(db);
      ret = 0;
    }
    sqlite3_mutex_leave(db->mutex);
  }
  return ret;
}